

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

unique_ptr<slang::ast::Compilation,_std::default_delete<slang::ast::Compilation>_> __thiscall
slang::driver::Driver::createCompilation(Driver *this)

{
  __shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  Compilation *pCVar2;
  char *pcVar3;
  Driver *in_RSI;
  shared_ptr<slang::syntax::SyntaxTree> *tree;
  __shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  string_view name;
  __shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2> local_88;
  __shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2> local_78;
  SourceLibrary *local_68;
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  local_60;
  size_t sVar4;
  
  if (((in_RSI->options).defaultLibName.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_engaged == true) &&
     (sVar4 = *(size_t *)
               ((long)&(in_RSI->options).defaultLibName.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_payload + 8), sVar4 != 0)) {
    pcVar3 = (in_RSI->options).defaultLibName.
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_payload._M_value._M_dataplus._M_p;
  }
  else {
    pcVar3 = "work";
    sVar4 = 4;
  }
  name._M_str = pcVar3;
  name._M_len = sVar4;
  local_68 = SourceLoader::getOrAddLibrary(&in_RSI->sourceLoader,name);
  local_68->isDefault = true;
  createOptionBag((Bag *)&local_60,in_RSI);
  std::make_unique<slang::ast::Compilation,slang::Bag,slang::SourceLibrary*&>
            ((Bag *)this,(SourceLibrary **)&local_60);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::~table_core(&local_60);
  p_Var1 = &((in_RSI->sourceLoader).libraryMapTrees.
             super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>;
  for (p_Var5 = &((in_RSI->sourceLoader).libraryMapTrees.
                  super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>;
      p_Var5 != p_Var1; p_Var5 = p_Var5 + 1) {
    pCVar2 = (Compilation *)(this->defaultComp).super_BumpAllocator.head;
    std::__shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_78,p_Var5);
    ast::Compilation::addSyntaxTree(pCVar2,(shared_ptr<slang::syntax::SyntaxTree> *)&local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  }
  p_Var1 = &((in_RSI->syntaxTrees).
             super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>;
  for (p_Var5 = &((in_RSI->syntaxTrees).
                  super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>;
      p_Var5 != p_Var1; p_Var5 = p_Var5 + 1) {
    pCVar2 = (Compilation *)(this->defaultComp).super_BumpAllocator.head;
    std::__shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_88,p_Var5);
    ast::Compilation::addSyntaxTree(pCVar2,(shared_ptr<slang::syntax::SyntaxTree> *)&local_88);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  }
  return (__uniq_ptr_data<slang::ast::Compilation,_std::default_delete<slang::ast::Compilation>,_true,_true>
          )(__uniq_ptr_data<slang::ast::Compilation,_std::default_delete<slang::ast::Compilation>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Compilation> Driver::createCompilation() {
    SourceLibrary* defaultLib;
    if (options.defaultLibName && !options.defaultLibName->empty())
        defaultLib = sourceLoader.getOrAddLibrary(*options.defaultLibName);
    else
        defaultLib = sourceLoader.getOrAddLibrary("work");

    SLANG_ASSERT(defaultLib);
    defaultLib->isDefault = true;

    auto compilation = std::make_unique<Compilation>(createOptionBag(), defaultLib);
    for (auto& tree : sourceLoader.getLibraryMaps())
        compilation->addSyntaxTree(tree);
    for (auto& tree : syntaxTrees)
        compilation->addSyntaxTree(tree);

    return compilation;
}